

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_flip(roaring_bitmap_t *x1,uint64_t range_start,uint64_t range_end)

{
  ushort uVar1;
  uint16_t *puVar2;
  rle16_t *prVar3;
  uint8_t uVar4;
  _Bool _Var5;
  uint8_t uVar6;
  uint16_t hb;
  uint uVar7;
  int iVar8;
  roaring_array_t *ra;
  roaring_bitmap_t *prVar9;
  run_container_t *c;
  uint64_t uVar10;
  long lVar11;
  ushort uVar12;
  run_container_t *prVar13;
  uint uVar14;
  long lVar15;
  uint16_t lb_start;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  int local_50;
  run_container_t *local_40;
  uint local_34;
  
  if (range_end <= range_start) {
    prVar9 = roaring_bitmap_copy(x1);
    return prVar9;
  }
  uVar10 = 0;
  if (range_end < 0x100000000) {
    uVar10 = range_end;
  }
  ra = &roaring_bitmap_create_with_capacity(0)->high_low_container;
  ra->flags = ra->flags & 0xfe | (x1->high_low_container).flags & 1;
  uVar18 = uVar10 - 1;
  uVar12 = (ushort)(range_start >> 0x10);
  ra_append_copies_until
            (ra,&x1->high_low_container,uVar12,(_Bool)((x1->high_low_container).flags & 1));
  hb = (uint16_t)(uVar18 >> 0x10);
  lb_start = (uint16_t)range_start;
  if (hb == uVar12) {
    insert_flipped_container(ra,&x1->high_low_container,uVar12,lb_start,(uint16_t)uVar18);
  }
  else {
    if (lb_start != 0) {
      insert_flipped_container(ra,&x1->high_low_container,uVar12,lb_start,0xffff);
      uVar12 = uVar12 + 1;
    }
    uVar14 = ((uint)(uVar18 >> 0x10) & 0xffff) - (uint)((uVar18 & 0xffff) != 0xffff);
    if (uVar12 <= (ushort)uVar14) {
      local_34 = uVar14 & 0xffff;
      uVar14 = (uint)uVar12;
      do {
        iVar8 = (x1->high_low_container).size;
        uVar12 = (ushort)uVar14;
        if (((long)iVar8 == 0) ||
           (puVar2 = (x1->high_low_container).keys, puVar2[(long)iVar8 + -1] == uVar12)) {
          uVar7 = iVar8 - 1;
        }
        else if (iVar8 < 1) {
          uVar7 = 0xffffffff;
        }
        else {
          iVar8 = iVar8 + -1;
          uVar16 = 0;
          do {
            uVar7 = iVar8 + uVar16 >> 1;
            uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar8 + uVar16 & 0xfffffffe));
            if (uVar1 < uVar12) {
              uVar16 = uVar7 + 1;
            }
            else {
              if (uVar1 <= uVar12) goto LAB_0011a952;
              iVar8 = uVar7 - 1;
            }
          } while ((int)uVar16 <= iVar8);
          uVar7 = ~uVar16;
        }
LAB_0011a952:
        iVar8 = ra->size;
        if (((long)iVar8 == 0) || (ra->keys[(long)iVar8 + -1] == uVar12)) {
          uVar16 = iVar8 - 1;
        }
        else if (iVar8 < 1) {
          uVar16 = 0xffffffff;
        }
        else {
          iVar8 = iVar8 + -1;
          uVar17 = 0;
          do {
            uVar16 = iVar8 + uVar17 >> 1;
            uVar1 = *(ushort *)((long)ra->keys + (ulong)(iVar8 + uVar17 & 0xfffffffe));
            if (uVar1 < uVar12) {
              uVar17 = uVar16 + 1;
            }
            else {
              if (uVar1 <= uVar12) goto LAB_0011a96f;
              iVar8 = uVar16 - 1;
            }
          } while ((int)uVar17 <= iVar8);
          uVar16 = ~uVar17;
        }
LAB_0011a96f:
        if ((int)uVar7 < 0) {
          c = run_container_create_given_capacity(1);
          if (c != (run_container_t *)0x0) {
            prVar3 = c->runs;
            iVar8 = c->n_runs;
            prVar3[iVar8].value = 0;
            prVar3[iVar8].length = 0xffff;
            c->n_runs = iVar8 + 1;
          }
          uVar4 = '\x03';
LAB_0011ab5e:
          ra_insert_new_key_value_at(ra,~uVar16,uVar12,c,uVar4);
        }
        else {
          uVar4 = (x1->high_low_container).typecodes[uVar7 & 0xffff];
          prVar13 = (run_container_t *)(x1->high_low_container).containers[uVar7 & 0xffff];
          if (uVar4 == '\x04') {
            uVar4 = *(uint8_t *)&prVar13->runs;
            if (uVar4 == '\x04') goto LAB_0011abcc;
            prVar13 = *(run_container_t **)prVar13;
          }
          local_40 = (run_container_t *)0x0;
          if (uVar4 == '\x03') {
            uVar7 = run_container_negation_range(prVar13,0,0x10000,&local_40);
            if (uVar7 != 4) goto LAB_0011ab24;
            uVar6 = *(uint8_t *)&local_40->runs;
            if (uVar6 == '\x04') {
LAB_0011abcc:
              __assert_fail("*type != SHARED_CONTAINER_TYPE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x1062,
                            "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                           );
            }
            c = local_40;
            prVar13 = *(run_container_t **)local_40;
            uVar4 = '\x04';
          }
          else if (uVar4 == '\x02') {
            c = (run_container_t *)bitset_container_create();
            memset(c->runs,0xff,0x2000);
            uVar10 = bitset_clear_list((uint64_t *)c->runs,0x10000,&prVar13->runs->value,
                                       (long)prVar13->n_runs);
            c->n_runs = (int32_t)uVar10;
            uVar6 = '\x01';
            prVar13 = c;
            uVar4 = uVar6;
          }
          else {
            if (uVar4 != '\x01') {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x1824,
                            "container_t *container_not(const container_t *, uint8_t, uint8_t *)");
            }
            _Var5 = bitset_container_negation_range
                              ((bitset_container_t *)prVar13,0,0x10000,&local_40);
            uVar7 = (uint)(byte)(2 - _Var5);
LAB_0011ab24:
            uVar6 = (uint8_t)uVar7;
            c = local_40;
            prVar13 = local_40;
            uVar4 = uVar6;
          }
          if (uVar6 == '\x03') {
            lVar11 = cpuid_Extended_Feature_Enumeration_info(7);
            if ((*(uint *)(lVar11 + 4) & 0x20) == 0) {
              iVar8 = prVar13->n_runs;
              lVar11 = (long)iVar8;
              if (0 < lVar11) {
                lVar15 = 0;
                do {
                  iVar8 = iVar8 + (uint)prVar13->runs[lVar15].length;
                  lVar15 = lVar15 + 1;
                } while (lVar11 != lVar15);
              }
            }
            else {
              iVar8 = _avx2_run_container_cardinality(prVar13);
            }
          }
          else {
            if ((uVar6 != '\x02') && (uVar6 != '\x01')) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x10fa,"int container_get_cardinality(const container_t *, uint8_t)");
            }
            iVar8 = prVar13->n_runs;
          }
          if (iVar8 != 0) goto LAB_0011ab5e;
          container_free(c,uVar4);
        }
        bVar19 = uVar14 != local_34;
        uVar14 = uVar14 + 1;
      } while (bVar19);
    }
    local_50 = (int)(uVar18 & 0xffff);
    if (local_50 != 0xffff) {
      insert_flipped_container(ra,&x1->high_low_container,hb,0,(uint16_t)uVar18);
    }
  }
  ra_append_copies_after(ra,&x1->high_low_container,hb,(_Bool)((x1->high_low_container).flags & 1));
  return (roaring_bitmap_t *)ra;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_flip(const roaring_bitmap_t *x1,
                                      uint64_t range_start,
                                      uint64_t range_end) {
    if (range_start >= range_end) {
        return roaring_bitmap_copy(x1);
    }
    if(range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }

    roaring_bitmap_t *ans = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(ans, is_cow(x1));

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;  // & 0xFFFF;
    uint16_t hb_end = (uint16_t)((range_end - 1) >> 16);
    const uint16_t lb_end = (uint16_t)(range_end - 1);  // & 0xFFFF;

    ra_append_copies_until(&ans->high_low_container, &x1->high_low_container,
                           hb_start, is_cow(x1));
    if (hb_start == hb_end) {
        insert_flipped_container(&ans->high_low_container,
                                 &x1->high_low_container, hb_start, lb_start,
                                 lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_start,
                                     lb_start, 0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;  // later we'll handle the partial block

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            insert_fully_flipped_container(&ans->high_low_container,
                                           &x1->high_low_container, hb);
        }

        // handle a partial final container
        if (lb_end != 0xFFFF) {
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_end + 1, 0,
                                     lb_end);
            ++hb_end;
        }
    }
    ra_append_copies_after(&ans->high_low_container, &x1->high_low_container,
                           hb_end, is_cow(x1));
    return ans;
}